

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall
ON_V5_MeshDoubleVertices::Read(ON_V5_MeshDoubleVertices *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool local_29;
  int local_28;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_V5_MeshDoubleVertices *this_local;
  
  this->m_fcount = 0;
  this->m_dcount = 0;
  this->m_fCRC = 0;
  this->m_dCRC = 0;
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  ON_SimpleArray<ON_3dPoint>::Destroy(&(this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>);
  iStack_24 = 0;
  local_28 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,&local_28);
  if (bVar1) {
    local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_fcount);
    if ((((local_29) &&
         (local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_dcount), local_29)) &&
        (local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_fCRC), local_29)) &&
       (local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_dCRC), local_29)) {
      local_29 = ON_BinaryArchive::ReadArray
                           (_minor_version,&(this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>);
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_29 = false;
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_V5_MeshDoubleVertices::Read(ON_BinaryArchive& file)
{
  m_fcount = 0;
  m_dcount = 0;
  m_fCRC = 0;
  m_dCRC = 0;
  m_V5_dV.Destroy();

  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;
  for(;;)
  {
    rc = file.ReadInt(&m_fcount);
    if (!rc)
      break;
    rc = file.ReadInt(&m_dcount);
    if (!rc)
      break;
    rc = file.ReadInt(&m_fCRC);
    if (!rc)
      break;
    rc = file.ReadInt(&m_dCRC);
    if (!rc)
      break;
    rc = file.ReadArray(m_V5_dV);
    if (!rc)
      break;
    break;
  }
  if ( !file.EndRead3dmChunk() )
    rc = false;
    return rc;
}